

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

void __thiscall dxil_spv::Converter::Impl::mark_used_values(Impl *this,Instruction *instruction)

{
  bool bVar1;
  uint uVar2;
  PHINode *this_00;
  PHINode *value;
  ReturnInst *this_01;
  Value *pVVar3;
  BranchInst *this_02;
  SwitchInst *this_03;
  undefined4 local_4c;
  uint n_1;
  uint i_1;
  SwitchInst *switch_inst;
  BranchInst *cond_inst;
  ReturnInst *ret_inst;
  Value *incoming;
  uint n;
  uint i;
  PHINode *phi_inst;
  Instruction *instruction_local;
  Impl *this_local;
  
  this_00 = LLVMBC::dyn_cast<LLVMBC::PHINode>(&instruction->super_Value);
  if (this_00 == (PHINode *)0x0) {
    this_01 = LLVMBC::dyn_cast<LLVMBC::ReturnInst>(&instruction->super_Value);
    if (this_01 == (ReturnInst *)0x0) {
      this_02 = LLVMBC::dyn_cast<LLVMBC::BranchInst>(&instruction->super_Value);
      if (this_02 == (BranchInst *)0x0) {
        this_03 = LLVMBC::dyn_cast<LLVMBC::SwitchInst>(&instruction->super_Value);
        if (this_03 == (SwitchInst *)0x0) {
          local_4c = 0;
          uVar2 = LLVMBC::Instruction::getNumOperands(instruction);
          for (; local_4c < uVar2; local_4c = local_4c + 1) {
            pVVar3 = LLVMBC::Instruction::getOperand(instruction,local_4c);
            mark_used_value(this,pVVar3);
          }
        }
        else {
          pVVar3 = LLVMBC::SwitchInst::getCondition(this_03);
          mark_used_value(this,pVVar3);
        }
      }
      else {
        bVar1 = LLVMBC::BranchInst::isConditional(this_02);
        if (bVar1) {
          pVVar3 = LLVMBC::BranchInst::getCondition(this_02);
          mark_used_value(this,pVVar3);
        }
      }
    }
    else {
      pVVar3 = LLVMBC::ReturnInst::getReturnValue(this_01);
      if (pVVar3 != (Value *)0x0) {
        pVVar3 = LLVMBC::ReturnInst::getReturnValue(this_01);
        mark_used_value(this,pVVar3);
      }
    }
  }
  else {
    incoming._4_4_ = 0;
    uVar2 = LLVMBC::PHINode::getNumIncomingValues(this_00);
    for (; incoming._4_4_ < uVar2; incoming._4_4_ = incoming._4_4_ + 1) {
      value = (PHINode *)LLVMBC::PHINode::getIncomingValue(this_00,incoming._4_4_);
      if (value != this_00) {
        mark_used_value(this,(Value *)value);
      }
    }
  }
  return;
}

Assistant:

void Converter::Impl::mark_used_values(const llvm::Instruction *instruction)
{
	if (auto *phi_inst = llvm::dyn_cast<llvm::PHINode>(instruction))
	{
		for (unsigned i = 0, n = phi_inst->getNumIncomingValues(); i < n; i++)
		{
			auto *incoming = phi_inst->getIncomingValue(i);
			// Ignore self-referential PHI. Someone else need to refer to us.
			if (incoming != phi_inst)
				mark_used_value(incoming);
		}
	}
	else if (const auto *ret_inst = llvm::dyn_cast<llvm::ReturnInst>(instruction))
	{
		if (ret_inst->getReturnValue())
			mark_used_value(ret_inst->getReturnValue());
	}
	else if (const auto *cond_inst = llvm::dyn_cast<llvm::BranchInst>(instruction))
	{
		if (cond_inst->isConditional())
			mark_used_value(cond_inst->getCondition());
	}
	else if (const auto *switch_inst = llvm::dyn_cast<llvm::SwitchInst>(instruction))
	{
		mark_used_value(switch_inst->getCondition());
	}
	else
	{
		for (unsigned i = 0, n = instruction->getNumOperands(); i < n; i++)
			mark_used_value(instruction->getOperand(i));
	}
}